

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t assertion_compare_fflags(char *file,wchar_t line,char *patha,char *pathb,wchar_t nomatch)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  wchar_t flagsb;
  wchar_t flagsa;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = open(patha,0x800);
  if (iVar1 < 0) {
    pcVar3 = "Can\'t open %s\n";
    pathb = patha;
  }
  else {
    iVar2 = ioctl(iVar1,0x80086601,&flagsa);
    close(iVar1);
    if (iVar2 < 0) {
      pcVar3 = "Can\'t get flags %s\n";
      pathb = patha;
    }
    else {
      iVar1 = open(pathb,0x800);
      if (iVar1 < 0) {
        pcVar3 = "Can\'t open %s\n";
      }
      else {
        iVar2 = ioctl(iVar1,0x80086601,&flagsb);
        close(iVar1);
        if (-1 < iVar2) {
          uVar4 = (ulong)(uint)flagsa;
          if (nomatch == L'\0') {
            if (flagsa == flagsb) {
              return L'\x01';
            }
            pcVar3 = "File flags should be identical: %s=%#010x %s=%#010x";
            flagsa = flagsb;
          }
          else {
            if (flagsa != flagsb) {
              return L'\x01';
            }
            pcVar3 = "File flags should be different: %s=%#010x %s=%#010x";
          }
          failure_start(file,line,pcVar3,patha,uVar4,pathb,flagsa);
          goto LAB_001057cf;
        }
        pcVar3 = "Can\'t get flags %s\n";
      }
    }
  }
  failure_start(file,line,pcVar3,pathb);
LAB_001057cf:
  failure_finish(file);
  return L'\0';
}

Assistant:

int
assertion_compare_fflags(const char *file, int line, const char *patha,
    const char *pathb, int nomatch)
{
#if defined(HAVE_STRUCT_STAT_ST_FLAGS) && defined(UF_NODUMP)
	struct stat sa, sb;

	assertion_count(file, line);

	if (stat(patha, &sa) < 0)
		return (0);
	if (stat(pathb, &sb) < 0)
		return (0);
	if (!nomatch && sa.st_flags != sb.st_flags) {
		failure_start(file, line, "File flags should be identical: "
		    "%s=%#010x %s=%#010x", patha, sa.st_flags, pathb,
		    sb.st_flags);
		failure_finish(NULL);
		return (0);
	}
	if (nomatch && sa.st_flags == sb.st_flags) {
		failure_start(file, line, "File flags should be different: "
		    "%s=%#010x %s=%#010x", patha, sa.st_flags, pathb,
		    sb.st_flags);
		failure_finish(NULL);
		return (0);
	}
#elif (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS) && \
       defined(FS_NODUMP_FL)) || \
      (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS) \
         && defined(EXT2_NODUMP_FL))
	int fd, r, flagsa, flagsb;

	assertion_count(file, line);
	fd = open(patha, O_RDONLY | O_NONBLOCK);
	if (fd < 0) {
		failure_start(file, line, "Can't open %s\n", patha);
		failure_finish(NULL);
		return (0);
	}
	r = ioctl(fd,
#ifdef FS_IOC_GETFLAGS
	    FS_IOC_GETFLAGS,
#else
	    EXT2_IOC_GETFLAGS,
#endif
	    &flagsa);
	close(fd);
	if (r < 0) {
		failure_start(file, line, "Can't get flags %s\n", patha);
		failure_finish(NULL);
		return (0);
	}
	fd = open(pathb, O_RDONLY | O_NONBLOCK);
	if (fd < 0) {
		failure_start(file, line, "Can't open %s\n", pathb);
		failure_finish(NULL);
		return (0);
	}
	r = ioctl(fd,
#ifdef FS_IOC_GETFLAGS
	    FS_IOC_GETFLAGS,
#else
	    EXT2_IOC_GETFLAGS,
#endif
	    &flagsb);
	close(fd);
	if (r < 0) {
		failure_start(file, line, "Can't get flags %s\n", pathb);
		failure_finish(NULL);
		return (0);
	}
	if (!nomatch && flagsa != flagsb) {
		failure_start(file, line, "File flags should be identical: "
		    "%s=%#010x %s=%#010x", patha, flagsa, pathb, flagsb);
		failure_finish(NULL);
		return (0);
	}
	if (nomatch && flagsa == flagsb) {
		failure_start(file, line, "File flags should be different: "
		    "%s=%#010x %s=%#010x", patha, flagsa, pathb, flagsb);
		failure_finish(NULL);
		return (0);
	}
#else
	(void)patha; /* UNUSED */
	(void)pathb; /* UNUSED */
	(void)nomatch; /* UNUSED */
	assertion_count(file, line);
#endif
	return (1);
}